

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trimesh_mscomplex.cpp
# Opt level: O0

void __thiscall
trimesh::merge_dag_t::get_contrib_cps
          (merge_dag_t *this,vector<int,_std::allocator<int>_> *l,eGDIR dir,int cp,int res)

{
  const_reference pvVar1;
  node_t *pnVar2;
  size_type sVar3;
  uint *puVar4;
  size_type sVar5;
  pair<std::_Rb_tree_const_iterator<int>,_bool> pVar6;
  undefined8 local_d8;
  node_t gnode;
  uint local_b8 [2];
  int g_1;
  undefined1 local_a8 [8];
  stack<int,_std::deque<int,_std::allocator<int>_>_> stk;
  set<int,_std::less<int>,_std::allocator<int>_> visited;
  int g;
  int res_local;
  int cp_local;
  eGDIR dir_local;
  vector<int,_std::allocator<int>_> *l_local;
  merge_dag_t *this_local;
  
  visited._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = res;
  pvVar1 = std::vector<int,_std::allocator<int>_>::operator[](this->m_cp_geom + dir,(long)cp);
  visited._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = *pvVar1;
  while (pnVar2 = get_node(this,(value_type)visited._M_t._M_impl.super__Rb_tree_header._M_node_count
                          ),
        visited._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ <= pnVar2->canc_no) {
    pnVar2 = get_node(this,(value_type)visited._M_t._M_impl.super__Rb_tree_header._M_node_count);
    visited._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = pnVar2->base;
  }
  std::set<int,_std::less<int>,_std::allocator<int>_>::set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)
             &stk.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
              _M_finish._M_node);
  std::stack<int,std::deque<int,std::allocator<int>>>::
  stack<std::deque<int,std::allocator<int>>,void>
            ((stack<int,std::deque<int,std::allocator<int>>> *)local_a8);
  std::stack<int,_std::deque<int,_std::allocator<int>_>_>::push
            ((stack<int,_std::deque<int,_std::allocator<int>_>_> *)local_a8,
             (value_type *)&visited._M_t._M_impl.super__Rb_tree_header._M_node_count);
  while (sVar3 = std::stack<int,_std::deque<int,_std::allocator<int>_>_>::size
                           ((stack<int,_std::deque<int,_std::allocator<int>_>_> *)local_a8),
        sVar3 != 0) {
    puVar4 = (uint *)std::stack<int,_std::deque<int,_std::allocator<int>_>_>::top
                               ((stack<int,_std::deque<int,_std::allocator<int>_>_> *)local_a8);
    local_b8[0] = *puVar4;
    std::stack<int,_std::deque<int,_std::allocator<int>_>_>::pop
              ((stack<int,_std::deque<int,_std::allocator<int>_>_> *)local_a8);
    sVar5 = std::set<int,_std::less<int>,_std::allocator<int>_>::count
                      ((set<int,_std::less<int>,_std::allocator<int>_> *)
                       &stk.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                        super__Deque_impl_data._M_finish._M_node,(key_type *)local_b8);
    if (sVar5 == 0) {
      pVar6 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                        ((set<int,_std::less<int>,_std::allocator<int>_> *)
                         &stk.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                          super__Deque_impl_data._M_finish._M_node,(value_type_conflict2 *)local_b8)
      ;
      register0x00000000 = pVar6.first._M_node;
      if ((int)local_b8[0] < 0) {
        gnode.other = ~local_b8[0];
        std::vector<int,_std::allocator<int>_>::push_back(l,&gnode.other);
      }
      pnVar2 = get_node(this,local_b8[0]);
      local_d8._0_4_ = pnVar2->base;
      local_d8._4_4_ = pnVar2->other;
      gnode.base = pnVar2->canc_no;
      if ((undefined4)local_d8 != -1) {
        std::stack<int,_std::deque<int,_std::allocator<int>_>_>::push
                  ((stack<int,_std::deque<int,_std::allocator<int>_>_> *)local_a8,
                   (value_type *)&local_d8);
        std::stack<int,_std::deque<int,_std::allocator<int>_>_>::push
                  ((stack<int,_std::deque<int,_std::allocator<int>_>_> *)local_a8,
                   (value_type *)((long)&local_d8 + 4));
      }
    }
  }
  std::stack<int,_std::deque<int,_std::allocator<int>_>_>::~stack
            ((stack<int,_std::deque<int,_std::allocator<int>_>_> *)local_a8);
  std::set<int,_std::less<int>,_std::allocator<int>_>::~set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)
             &stk.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
              _M_finish._M_node);
  return;
}

Assistant:

void merge_dag_t::get_contrib_cps
(std::vector<int> &l, eGDIR dir,int cp,int res) const
{
  int g = m_cp_geom[dir][cp];

  while(get_node(g).canc_no >= res )
    g = get_node(g).base;

  std::set<int>    visited;

  std::stack<int> stk;

  stk.push(g);

  while(stk.size() != 0 )
  {
    int g = stk.top();
    stk.pop();

    if(visited.count(g) != 0 )
      continue;

    visited.insert(g);

    if( g < 0)
      l.push_back(-g-1);

    node_t gnode = get_node(g);

    if(gnode.base != -1)
    {
      stk.push(gnode.base);
      stk.push(gnode.other);
    }
  }
}